

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::sortTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__return_storage_ptr__,
                IConfig *config,
                vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *unsortedTestCases)

{
  int iVar1;
  iterator iVar2;
  iterator __last;
  RandomNumberGenerator local_4a [2];
  RandomNumberGenerator rng;
  iterator iStack_48;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *unsortedTestCases_local;
  IConfig *config_local;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *sorted;
  
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            (__return_storage_ptr__,unsortedTestCases);
  iVar1 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])();
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      iVar2 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                        (__return_storage_ptr__);
      iStack_48 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                            (__return_storage_ptr__);
      std::
      sort<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,Catch::LexSort>
                (iVar2._M_current,iStack_48._M_current);
    }
    else if (iVar1 == 2) {
      seedRng(config);
      iVar2 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                        (__return_storage_ptr__);
      __last = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                         (__return_storage_ptr__);
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,Catch::RandomNumberGenerator&>
                ((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  )iVar2._M_current,
                 (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  )__last._M_current,local_4a);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<TestCase> sortTests( IConfig const& config, std::vector<TestCase> const& unsortedTestCases ) {

        std::vector<TestCase> sorted = unsortedTestCases;

        switch( config.runOrder() ) {
            case RunTests::InLexicographicalOrder:
                std::sort( sorted.begin(), sorted.end(), LexSort() );
                break;
            case RunTests::InRandomOrder:
                {
                    seedRng( config );

                    RandomNumberGenerator rng;
                    std::random_shuffle( sorted.begin(), sorted.end(), rng );
                }
                break;
            case RunTests::InDeclarationOrder:
                // already in declaration order
                break;
        }
        return sorted;
    }